

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O0

bool __thiscall
ApprovalTests::CommandReporter::report(CommandReporter *this,string *received,string *approved)

{
  long *plVar1;
  bool bVar2;
  byte bVar3;
  string *in_RDX;
  long in_RDI;
  string *in_stack_000001d8;
  string *in_stack_000001e0;
  CommandReporter *in_stack_000001e8;
  string *in_stack_ffffffffffffffb0;
  string local_40 [32];
  bool local_1;
  
  bVar2 = exists(in_RDX);
  if (bVar2) {
    FileUtils::ensureFileExists(in_stack_ffffffffffffffb0);
    plVar1 = *(long **)(in_RDI + 0x48);
    assembleFullCommand(in_stack_000001e8,in_stack_000001e0,in_stack_000001d8);
    bVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,local_40);
    local_1 = (bool)(bVar3 & 1);
    ::std::__cxx11::string::~string(local_40);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CommandReporter::report(std::string received, std::string approved) const
    {
        if (!exists(cmd))
        {
            return false;
        }
        FileUtils::ensureFileExists(approved);
        return l->launch(assembleFullCommand(received, approved));
    }